

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildEnum
          (DescriptorBuilder *this,EnumDescriptorProto *proto,Descriptor *parent,
          EnumDescriptor *result,FlatAllocator *alloc)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  char *pcVar1;
  unsigned_short uVar2;
  SymbolVisibility SVar3;
  int iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int iVar7;
  string *psVar8;
  EnumValueDescriptorProto *pEVar9;
  long lVar10;
  EnumValueDescriptor *pEVar11;
  ReservedRange *pRVar12;
  EnumDescriptorProto_EnumReservedRange *pEVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar14;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  bool bVar15;
  string_view sVar16;
  anon_class_8_1_a8c68091 local_248;
  VoidPtr local_240;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_238;
  string_view local_230;
  string_view local_220;
  anon_class_8_1_a8c68091 local_210;
  VoidPtr local_208;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_200;
  string_view local_1f8;
  ReservedRange *local_1e8;
  ReservedRange *range;
  EnumValueDescriptor *pEStack_1d8;
  int j_1;
  EnumValueDescriptor *value;
  anon_class_8_1_898f2789 aStack_1c8;
  int i_5;
  VoidPtr local_1c0;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_1b8;
  string_view local_1b0;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
  local_1a0;
  reference local_188;
  string *name;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range2;
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  reserved_name_set;
  VoidPtr local_128;
  Invoker<std::__cxx11::basic_string<char>_> local_120;
  string_view local_118;
  MaybeInitializedPtr local_108;
  EnumDescriptorProto_EnumReservedRange *range2;
  EnumDescriptorProto_EnumReservedRange *pEStack_f8;
  int j;
  EnumDescriptorProto_EnumReservedRange *range1;
  Symbol SStack_e8;
  int i_4;
  string_view local_e0;
  string_view local_d0;
  string_view local_c0;
  int local_ac;
  int local_a8;
  int i_3;
  int reserved_name_count;
  int i_2;
  int i_1;
  int i;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  size_t local_58;
  char *local_50;
  char *local_48;
  undefined1 local_40 [8];
  string_view scope;
  FlatAllocator *alloc_local;
  EnumDescriptor *result_local;
  Descriptor *parent_local;
  EnumDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  scope._M_str = (char *)alloc;
  if (parent == (Descriptor *)0x0) {
    _local_40 = FileDescriptor::package(this->file_);
  }
  else {
    _local_40 = Descriptor::full_name(parent);
  }
  local_58 = (size_t)local_40;
  local_50 = (char *)scope._M_len;
  psVar8 = EnumDescriptorProto::name_abi_cxx11_(proto);
  local_68 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar8)
  ;
  sVar16._M_str = local_50;
  sVar16._M_len = local_58;
  local_48 = (char *)AllocateNameStrings(this,sVar16,local_68,&proto->super_Message,
                                         (FlatAllocator *)scope._M_str);
  (result->all_names_).payload_ = local_48;
  psVar8 = EnumDescriptorProto::name_abi_cxx11_(proto);
  local_78 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar8)
  ;
  local_88 = EnumDescriptor::full_name(result);
  ValidateSymbolName(this,local_78,local_88,&proto->super_Message);
  result->file_ = this->file_;
  result->containing_type_ = parent;
  result->field_0x1 = result->field_0x1 & 0xfe;
  result->field_0x1 = result->field_0x1 & 0xfd;
  SVar3 = EnumDescriptorProto::visibility(proto);
  result->field_0x1 = result->field_0x1 & 0xf3 | ((byte)SVar3 & 3) << 2;
  iVar4 = EnumDescriptorProto::value_size(proto);
  if (iVar4 == 0) {
    _i_1 = EnumDescriptor::full_name(result);
    AddError(this,_i_1,&proto->super_Message,NAME,"Enums must contain at least one value.");
  }
  i_2 = 0;
  while( true ) {
    iVar4 = i_2;
    uVar2 = std::numeric_limits<unsigned_short>::max();
    iVar7 = i_2;
    bVar15 = false;
    if (iVar4 < (int)(uint)uVar2) {
      iVar4 = EnumDescriptorProto::value_size(proto);
      bVar15 = false;
      if (iVar7 < iVar4) {
        pEVar9 = EnumDescriptorProto::value(proto,i_2);
        iVar5 = EnumValueDescriptorProto::number(pEVar9);
        lVar10 = (long)i_2;
        pEVar9 = EnumDescriptorProto::value(proto,0);
        iVar6 = EnumValueDescriptorProto::number(pEVar9);
        bVar15 = (long)iVar5 == lVar10 + iVar6;
      }
    }
    if (!bVar15) break;
    result->sequential_value_limit_ = (int16_t)i_2;
    i_2 = i_2 + 1;
  }
  iVar4 = EnumDescriptorProto::value_size(proto);
  pcVar1 = scope._M_str;
  result->value_count_ = iVar4;
  iVar4 = EnumDescriptorProto::value_size(proto);
  pEVar11 = anon_unknown_24::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::EnumValueDescriptor>
                      ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                        *)pcVar1,iVar4);
  result->values_ = pEVar11;
  reserved_name_count = 0;
  while( true ) {
    iVar4 = reserved_name_count;
    iVar7 = EnumDescriptorProto::value_size(proto);
    if (iVar7 <= iVar4) break;
    pEVar9 = EnumDescriptorProto::value(proto,reserved_name_count);
    BuildEnumValue(this,pEVar9,result,result->values_ + reserved_name_count,
                   (FlatAllocator *)scope._M_str);
    reserved_name_count = reserved_name_count + 1;
  }
  iVar4 = EnumDescriptorProto::reserved_range_size(proto);
  pcVar1 = scope._M_str;
  result->reserved_range_count_ = iVar4;
  iVar4 = EnumDescriptorProto::reserved_range_size(proto);
  pRVar12 = anon_unknown_24::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::EnumDescriptor::ReservedRange>
                      ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                        *)pcVar1,iVar4);
  result->reserved_ranges_ = pRVar12;
  i_3 = 0;
  while( true ) {
    iVar4 = i_3;
    iVar7 = EnumDescriptorProto::reserved_range_size(proto);
    if (iVar7 <= iVar4) break;
    pEVar13 = EnumDescriptorProto::reserved_range(proto,i_3);
    BuildReservedRange(this,pEVar13,result,result->reserved_ranges_ + i_3,
                       (FlatAllocator *)scope._M_str);
    i_3 = i_3 + 1;
  }
  local_a8 = EnumDescriptorProto::reserved_name_size(proto);
  result->reserved_name_count_ = local_a8;
  ppbVar14 = protobuf::(anonymous_namespace)::
             FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
             ::AllocateArray<std::__cxx11::string_const*>
                       ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                         *)scope._M_str,local_a8);
  result->reserved_names_ = ppbVar14;
  for (local_ac = 0; pcVar1 = scope._M_str, local_ac < local_a8; local_ac = local_ac + 1) {
    psVar8 = EnumDescriptorProto::reserved_name_abi_cxx11_(proto,local_ac);
    psVar8 = protobuf::(anonymous_namespace)::
             FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
             ::AllocateStrings<std::__cxx11::string_const&>
                       ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                         *)pcVar1,psVar8);
    result->reserved_names_[local_ac] = psVar8;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c0,"google.protobuf.EnumOptions");
  AllocateOptions<google::protobuf::EnumDescriptor>
            (this,proto,result,3,local_c0,(FlatAllocator *)scope._M_str);
  local_d0 = EnumDescriptor::full_name(result);
  local_e0 = EnumDescriptor::name(result);
  Symbol::Symbol(&stack0xffffffffffffff18,result);
  AddSymbol(this,local_d0,parent,local_e0,&proto->super_Message,SStack_e8);
  range1._4_4_ = 0;
  while( true ) {
    iVar4 = range1._4_4_;
    iVar7 = EnumDescriptorProto::reserved_range_size(proto);
    if (iVar7 <= iVar4) break;
    pEStack_f8 = EnumDescriptorProto::reserved_range(proto,range1._4_4_);
    range2._4_4_ = range1._4_4_;
    while( true ) {
      range2._4_4_ = range2._4_4_ + 1;
      iVar4 = range2._4_4_;
      iVar7 = EnumDescriptorProto::reserved_range_size(proto);
      if (iVar7 <= iVar4) break;
      local_108.p = EnumDescriptorProto::reserved_range(proto,range2._4_4_);
      iVar5 = EnumDescriptorProto_EnumReservedRange::end(pEStack_f8);
      iVar6 = EnumDescriptorProto_EnumReservedRange::start
                        ((EnumDescriptorProto_EnumReservedRange *)local_108.p);
      if (iVar6 <= iVar5) {
        iVar5 = EnumDescriptorProto_EnumReservedRange::end
                          ((EnumDescriptorProto_EnumReservedRange *)local_108.p);
        iVar6 = EnumDescriptorProto_EnumReservedRange::start(pEStack_f8);
        if (iVar6 <= iVar5) {
          local_118 = EnumDescriptor::full_name(result);
          pEVar13 = EnumDescriptorProto::reserved_range(proto,range1._4_4_);
          reserved_name_set.
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          heap_or_soo_.heap.slot_array = local_108;
          absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
          FunctionRef<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__0,void>
                    ((FunctionRef<std::__cxx11::string()> *)&local_128,
                     (anon_class_16_2_65e56138 *)
                     ((long)&reserved_name_set.
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             .settings_.
                             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                             .
                             super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                             .value.heap_or_soo_ + 8));
          make_error.invoker_ = local_120;
          make_error.ptr_.obj = local_128.obj;
          AddError(this,local_118,&pEVar13->super_Message,NUMBER,make_error);
        }
      }
    }
    range1._4_4_ = range1._4_4_ + 1;
  }
  absl::lts_20250127::
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::flat_hash_set((flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)&__range2);
  this_00 = EnumDescriptorProto::reserved_name_abi_cxx11_(proto);
  __end2 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin(this_00);
  name = (string *)
         RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::end(this_00);
  while( true ) {
    bVar15 = internal::operator!=(&__end2,(iterator *)&name);
    if (!bVar15) break;
    local_188 = internal::
                RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&__end2);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_1a0,
               (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)&__range2,local_188);
    if (((local_1a0.second ^ 0xffU) & 1) != 0) {
      sVar16 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_188);
      aStack_1c8.name = local_188;
      local_1b0 = sVar16;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__1,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_1c0,&stack0xfffffffffffffe38);
      make_error_00.invoker_ = p_Stack_1b8;
      make_error_00.ptr_.obj = local_1c0.obj;
      AddError(this,local_1b0,&proto->super_Message,NAME,make_error_00);
    }
    internal::
    RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  value._4_4_ = 0;
  while( true ) {
    iVar4 = value._4_4_;
    iVar7 = EnumDescriptor::value_count(result);
    if (iVar7 <= iVar4) break;
    pEStack_1d8 = EnumDescriptor::value(result,value._4_4_);
    range._4_4_ = 0;
    while( true ) {
      iVar4 = range._4_4_;
      iVar7 = EnumDescriptor::reserved_range_count(result);
      if (iVar7 <= iVar4) break;
      local_1e8 = EnumDescriptor::reserved_range(result,range._4_4_);
      iVar4 = local_1e8->start;
      iVar7 = EnumValueDescriptor::number(pEStack_1d8);
      if (iVar4 <= iVar7) {
        iVar4 = EnumValueDescriptor::number(pEStack_1d8);
        if (iVar4 <= local_1e8->end) {
          sVar16 = EnumValueDescriptor::full_name(pEStack_1d8);
          local_1f8 = sVar16;
          pEVar13 = EnumDescriptorProto::reserved_range(proto,range._4_4_);
          local_210.value = &stack0xfffffffffffffe28;
          absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
          FunctionRef<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__2,void>
                    ((FunctionRef<std::__cxx11::string()> *)&local_208,&local_210);
          make_error_01.invoker_ = p_Stack_200;
          make_error_01.ptr_.obj = local_208.obj;
          AddError(this,local_1f8,&pEVar13->super_Message,NUMBER,make_error_01);
        }
      }
      range._4_4_ = range._4_4_ + 1;
    }
    sVar16 = EnumValueDescriptor::name(pEStack_1d8);
    local_220 = sVar16;
    bVar15 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
             ::contains<std::basic_string_view<char,std::char_traits<char>>>
                       ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                         *)&__range2,&local_220);
    if (bVar15) {
      sVar16 = EnumValueDescriptor::full_name(pEStack_1d8);
      local_230 = sVar16;
      pEVar9 = EnumDescriptorProto::value(proto,value._4_4_);
      local_248.value = &stack0xfffffffffffffe28;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__3,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_240,&local_248);
      make_error_02.invoker_ = p_Stack_238;
      make_error_02.ptr_.obj = local_240.obj;
      AddError(this,local_230,&pEVar9->super_Message,NAME,make_error_02);
    }
    value._4_4_ = value._4_4_ + 1;
  }
  absl::lts_20250127::
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~flat_hash_set((flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)&__range2);
  return;
}

Assistant:

void DescriptorBuilder::BuildEnum(const EnumDescriptorProto& proto,
                                  const Descriptor* parent,
                                  EnumDescriptor* result,
                                  internal::FlatAllocator& alloc) {
  const absl::string_view scope =
      (parent == nullptr) ? file_->package() : parent->full_name();

  result->all_names_ = AllocateNameStrings(scope, proto.name(), proto, alloc);
  ValidateSymbolName(proto.name(), result->full_name(), proto);
  result->file_ = file_;
  result->containing_type_ = parent;
  result->is_placeholder_ = false;
  result->is_unqualified_placeholder_ = false;
  result->visibility_ = static_cast<uint8_t>(proto.visibility());

  if (proto.value_size() == 0) {
    // We cannot allow enums with no values because this would mean there
    // would be no valid default value for fields of this type.
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
             "Enums must contain at least one value.");
  }

  // Calculate the continuous sequence of the labels.
  // These can be fast-path'd during lookup and don't need to be added to the
  // tables.
  // We use uint16_t to save space for sequential_value_limit_, so stop before
  // overflowing it. Worst case, we are not taking full advantage on huge
  // enums, but it is unlikely.
  for (int i = 0;
       i < std::numeric_limits<uint16_t>::max() && i < proto.value_size() &&
       // We do the math in int64_t to avoid overflows.
       proto.value(i).number() ==
           static_cast<int64_t>(i) + proto.value(0).number();
       ++i) {
    result->sequential_value_limit_ = i;
  }

  BUILD_ARRAY(proto, result, value, BuildEnumValue, result);
  BUILD_ARRAY(proto, result, reserved_range, BuildReservedRange, result);

  // Copy reserved names.
  int reserved_name_count = proto.reserved_name_size();
  result->reserved_name_count_ = reserved_name_count;
  result->reserved_names_ =
      alloc.AllocateArray<const std::string*>(reserved_name_count);
  for (int i = 0; i < reserved_name_count; ++i) {
    result->reserved_names_[i] = alloc.AllocateStrings(proto.reserved_name(i));
  }

  // Copy options.
  AllocateOptions(proto, result, EnumDescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.EnumOptions", alloc);

  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));

  for (int i = 0; i < proto.reserved_range_size(); i++) {
    const EnumDescriptorProto_EnumReservedRange& range1 =
        proto.reserved_range(i);
    for (int j = i + 1; j < proto.reserved_range_size(); j++) {
      const EnumDescriptorProto_EnumReservedRange& range2 =
          proto.reserved_range(j);
      if (range1.end() >= range2.start() && range2.end() >= range1.start()) {
        AddError(result->full_name(), proto.reserved_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Reserved range $0 to $1 overlaps with "
                       "already-defined range $2 to $3.",
                       range2.start(), range2.end(), range1.start(),
                       range1.end());
                 });
      }
    }
  }

  absl::flat_hash_set<absl::string_view> reserved_name_set;
  for (const std::string& name : proto.reserved_name()) {
    if (!reserved_name_set.insert(name).second) {
      AddError(name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
        return absl::Substitute("Enum value \"$0\" is reserved multiple times.",
                                name);
      });
    }
  }

  for (int i = 0; i < result->value_count(); i++) {
    const EnumValueDescriptor* value = result->value(i);
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const EnumDescriptor::ReservedRange* range = result->reserved_range(j);
      if (range->start <= value->number() && value->number() <= range->end) {
        AddError(value->full_name(), proto.reserved_range(j),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Enum value \"$0\" uses reserved number $1.",
                       value->name(), value->number());
                 });
      }
    }
    if (reserved_name_set.contains(value->name())) {
      AddError(value->full_name(), proto.value(i),
               DescriptorPool::ErrorCollector::NAME, [&] {
                 return absl::Substitute("Enum value \"$0\" is reserved.",
                                         value->name());
               });
    }
  }
}